

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O0

void __thiscall
libtorrent::aux::session_impl::session_impl
          (session_impl *this,io_context *ioc,
          vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *pack,
          disk_io_constructor_type *disk_io_constructor,session_flags_t flags)

{
  bool bVar1;
  int queue_limit;
  uint val;
  rep rVar2;
  time_point<std::chrono::_V2::system_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  tVar3;
  stat *__buf;
  io_context *ios;
  bitfield_flag local_229;
  session_impl *local_228;
  code *local_220;
  undefined8 local_218;
  type local_210;
  incoming_utp_callback_t local_1f8;
  session_impl *local_1d8;
  code *local_1d0;
  undefined8 local_1c8;
  type local_1c0;
  send_fun_t local_1a8;
  anon_class_8_1_8991fb9c local_188;
  incoming_utp_callback_t local_180;
  session_impl *local_160;
  code *local_158;
  undefined8 local_150;
  type local_148;
  send_fun_t local_130;
  int local_10c;
  duration<long,_std::ratio<1L,_1000L>_> local_108;
  session_impl *local_100;
  code *local_f8;
  undefined8 local_f0;
  type local_e8;
  send_fun_hostname_t local_d0;
  session_impl *local_b0;
  code *local_a8;
  undefined8 local_a0;
  type local_98;
  send_fun_t local_80;
  function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
  local_60;
  alert_category_t local_40 [4];
  disk_io_constructor_type *local_30;
  disk_io_constructor_type *disk_io_constructor_local;
  vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *pack_local;
  io_context *ioc_local;
  session_impl *this_local;
  session_flags_t flags_local;
  
  local_30 = disk_io_constructor;
  disk_io_constructor_local = (disk_io_constructor_type *)pack;
  pack_local = (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *)
               ioc;
  ioc_local = (io_context *)this;
  this_local._7_1_ = flags.m_val;
  session_interface::session_interface(&this->super_session_interface);
  libtorrent::dht::dht_observer::dht_observer(&this->super_dht_observer);
  portmap_callback::portmap_callback(&this->super_portmap_callback);
  lsd_callback::lsd_callback(&this->super_lsd_callback);
  error_handler_interface::error_handler_interface(&this->super_error_handler_interface);
  ::std::enable_shared_from_this<libtorrent::aux::session_impl>::enable_shared_from_this
            (&this->super_enable_shared_from_this<libtorrent::aux::session_impl>);
  (this->super_session_interface).super_session_logger._vptr_session_logger =
       (_func_int **)&PTR_should_log_00b8f158;
  (this->super_dht_observer).super_dht_logger._vptr_dht_logger =
       (_func_int **)&PTR_should_log_00b8f470;
  (this->super_portmap_callback)._vptr_portmap_callback =
       (_func_int **)&PTR_on_port_mapping_00b8f4c8;
  (this->super_lsd_callback)._vptr_lsd_callback = (_func_int **)&DAT_00b8f4f0;
  (this->super_error_handler_interface)._vptr_error_handler_interface =
       (_func_int **)&PTR_on_exception_00b8f518;
  ::std::mutex::mutex(&this->mut);
  ::std::condition_variable::condition_variable(&this->cond);
  session_settings::session_settings(&this->m_settings,(settings_pack *)disk_io_constructor_local);
  container_wrapper<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_libtorrent::aux::strong_typedef<int,_libtorrent::aux::torrent_list_tag,_void>,_std::array<libtorrent::aux::container_wrapper<libtorrent::aux::torrent_*,_int,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>,_8UL>_>
  ::container_wrapper(&this->m_torrent_lists);
  peer_class_pool::peer_class_pool(&this->m_classes);
  counters::counters(&this->m_stats_counters);
  torrent_peer_allocator::torrent_peer_allocator(&this->m_peer_allocator);
  ::std::vector<libtorrent::block_info,_std::allocator<libtorrent::block_info>_>::vector
            (&this->m_block_info_storage);
  this->m_io_context = (io_context *)pack_local;
  boost::asio::ssl::context::context(&this->m_ssl_ctx,tls_client);
  boost::asio::ssl::context::context(&this->m_peer_ssl_ctx,tls);
  queue_limit = session_settings::get_int(&this->m_settings,0x4063);
  val = session_settings::get_int(&this->m_settings,0x4075);
  libtorrent::flags::bitfield_flag<unsigned_int,_libtorrent::alert_category_tag,_void>::
  bitfield_flag(local_40,val);
  alert_manager::alert_manager(&this->m_alerts,queue_limit,local_40[0]);
  bVar1 = ::std::function::operator_cast_to_bool((function *)disk_io_constructor);
  if (bVar1) {
    ::std::
    function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
    ::function(&local_60,disk_io_constructor);
  }
  else {
    ::std::
    function<std::unique_ptr<libtorrent::disk_interface,std::default_delete<libtorrent::disk_interface>>(boost::asio::io_context&,libtorrent::settings_interface_const&,libtorrent::counters&)>
    ::
    function<std::unique_ptr<libtorrent::disk_interface,std::default_delete<libtorrent::disk_interface>>(&)(boost::asio::io_context&,libtorrent::settings_interface_const&,libtorrent::counters&),void>
              ((function<std::unique_ptr<libtorrent::disk_interface,std::default_delete<libtorrent::disk_interface>>(boost::asio::io_context&,libtorrent::settings_interface_const&,libtorrent::counters&)>
                *)&local_60,default_disk_io_constructor);
  }
  ::std::
  function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
  ::operator()((function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
                *)&this->m_disk_thread,(io_context *)&local_60,
               (settings_interface *)this->m_io_context,(counters *)&this->m_settings);
  ::std::
  function<std::unique_ptr<libtorrent::disk_interface,_std::default_delete<libtorrent::disk_interface>_>_(boost::asio::io_context_&,_const_libtorrent::settings_interface_&,_libtorrent::counters_&)>
  ::~function(&local_60);
  bandwidth_manager::bandwidth_manager(&this->m_download_rate,1);
  bandwidth_manager::bandwidth_manager(&this->m_upload_rate,0);
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::strong_typedef
            (&this->m_global_class,0);
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::strong_typedef
            (&this->m_tcp_peer_class,0);
  strong_typedef<unsigned_int,_libtorrent::peer_class_tag,_void>::strong_typedef
            (&this->m_local_peer_class,0);
  resolver::resolver(&this->m_host_resolver,this->m_io_context);
  local_a8 = send_udp_packet_listen;
  local_a0 = 0;
  local_b0 = this;
  ::std::
  bind<void(libtorrent::aux::session_impl::*)(libtorrent::aux::listen_socket_handle_const&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>),libtorrent::aux::session_impl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&,std::_Placeholder<5>const&>
            (&local_98,(offset_in_session_impl_to_subr *)&local_a8,&local_b0,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
             ,(_Placeholder<3> *)&::std::placeholders::_3,
             (_Placeholder<4> *)&::std::placeholders::_4,(_Placeholder<5> *)&::std::placeholders::_5
            );
  ::std::
  function<void(libtorrent::aux::listen_socket_handle_const&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(libtorrent::aux::listen_socket_handle_const&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>,void>
            ((function<void(libtorrent::aux::listen_socket_handle_const&,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
              *)&local_80,&local_98);
  local_f8 = send_udp_packet_hostname_listen;
  local_f0 = 0;
  local_100 = this;
  ::std::
  bind<void(libtorrent::aux::session_impl::*)(libtorrent::aux::listen_socket_handle_const&,char_const*,int,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>),libtorrent::aux::session_impl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&,std::_Placeholder<5>const&,std::_Placeholder<6>const&>
            (&local_e8,(offset_in_session_impl_to_subr *)&local_f8,&local_100,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
             ,(_Placeholder<3> *)&::std::placeholders::_3,
             (_Placeholder<4> *)&::std::placeholders::_4,(_Placeholder<5> *)&::std::placeholders::_5
             ,(_Placeholder<6> *)&::std::placeholders::_6);
  ::std::
  function<void(libtorrent::aux::listen_socket_handle_const&,char_const*,int,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>,std::_Placeholder<6>))(libtorrent::aux::listen_socket_handle_const&,char_const*,int,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>,void>
            ((function<void(libtorrent::aux::listen_socket_handle_const&,char_const*,int,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
              *)&local_d0,&local_e8);
  tracker_manager::tracker_manager
            (&this->m_tracker_manager,&local_80,&local_d0,&this->m_stats_counters,
             &(this->m_host_resolver).super_resolver_interface,&this->m_settings,
             (session_logger *)this);
  ::std::
  function<void_(const_libtorrent::aux::listen_socket_handle_&,_const_char_*,_int,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::~function(&local_d0);
  ::std::
  function<void_(const_libtorrent::aux::listen_socket_handle_&,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::~function(&local_80);
  torrent_list<libtorrent::aux::torrent>::torrent_list(&this->m_torrents);
  container_wrapper<libtorrent::aux::torrent_*,_libtorrent::aux::strong_typedef<int,_libtorrent::queue_position_tag,_void>,_std::vector<libtorrent::aux::torrent_*,_std::allocator<libtorrent::aux::torrent_*>_>_>
  ::container_wrapper(&this->m_download_queue);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::peer_connection>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::vector(&this->m_undead_peers);
  boost::asio::make_work_guard<boost::asio::io_context>
            (&this->m_work,this->m_io_context,(type *)0x0);
  ::std::
  set<std::shared_ptr<libtorrent::aux::peer_connection>,_std::less<std::shared_ptr<libtorrent::aux::peer_connection>_>,_std::allocator<std::shared_ptr<libtorrent::aux::peer_connection>_>_>
  ::set(&this->m_connections);
  ::std::set<$8bc1ef71$>::set(&this->m_incoming_sockets);
  ip_filter::ip_filter(&this->m_peer_class_filter);
  peer_class_type_filter::peer_class_type_filter(&this->m_peer_class_type_filter);
  ::std::shared_ptr<libtorrent::ip_filter>::shared_ptr(&this->m_ip_filter);
  port_filter::port_filter(&this->m_port_filter);
  ::std::
  unique_ptr<libtorrent::aux::ip_change_notifier,std::default_delete<libtorrent::aux::ip_change_notifier>>
  ::unique_ptr<std::default_delete<libtorrent::aux::ip_change_notifier>,void>
            ((unique_ptr<libtorrent::aux::ip_change_notifier,std::default_delete<libtorrent::aux::ip_change_notifier>>
              *)&this->m_ip_notifier);
  ::std::
  vector<libtorrent::aux::listen_interface_t,_std::allocator<libtorrent::aux::listen_interface_t>_>
  ::vector(&this->m_listen_interfaces);
  ::std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_outgoing_interfaces);
  ::std::
  vector<std::shared_ptr<libtorrent::aux::listen_socket_t>,_std::allocator<std::shared_ptr<libtorrent::aux::listen_socket_t>_>_>
  ::vector(&this->m_listen_sockets);
  this->m_listen_socket_version = 0;
  ios = this->m_io_context;
  i2p_connection::i2p_connection(&this->m_i2p_conn,ios);
  ::std::
  optional<libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>_>
  ::optional(&this->m_i2p_listen_socket);
  this->m_interface_index = '\0';
  libtorrent::dht::dht_state::dht_state(&this->m_dht_state);
  this->m_unchoke_time_scaler = 0;
  this->m_auto_manage_time_scaler = 0;
  this->m_optimistic_unchoke_time_scaler = 0;
  this->m_disconnect_time_scaler = 0x5a;
  this->m_auto_scrape_time_scaler = 0xb4;
  stat::stat(&this->m_stat,(char *)ios,__buf);
  rVar2 = ::std::chrono::_V2::system_clock::now();
  (this->m_created).__d.__r = rVar2;
  (this->m_last_tick).__d.__r = (this->m_created).__d.__r;
  local_10c = 900;
  ::std::chrono::duration<long,std::ratio<1l,1000l>>::duration<int,void>
            ((duration<long,std::ratio<1l,1000l>> *)&local_108,&local_10c);
  tVar3 = ::std::chrono::operator-(&this->m_created,&local_108);
  (this->m_last_second_tick).__d.__r = (rep)tVar3.__d.__r;
  (this->m_last_choke).__d.__r = (this->m_created).__d.__r;
  (this->m_last_auto_manage).__d.__r = (this->m_created).__d.__r;
  this->m_next_port = 0;
  ::std::
  unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>
  ::unique_ptr<std::default_delete<libtorrent::dht::dht_storage_interface>,void>
            ((unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>
              *)&this->m_dht_storage);
  ::std::shared_ptr<libtorrent::dht::dht_tracker>::shared_ptr(&this->m_dht);
  ::std::
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>
  ::
  function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(&)(libtorrent::settings_interface_const&),void>
            ((function<std::unique_ptr<libtorrent::dht::dht_storage_interface,std::default_delete<libtorrent::dht::dht_storage_interface>>(libtorrent::settings_interface_const&)>
              *)&this->m_dht_storage_constructor,libtorrent::dht::dht_default_storage_constructor);
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::vector(&this->m_dht_router_nodes);
  ::std::
  vector<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>,_std::allocator<boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_>_>
  ::vector(&this->m_dht_nodes);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>
            (&this->m_dht_announce_timer,this->m_io_context,(type *)0x0);
  this->m_dht_interval_update_torrents = 0;
  this->m_outstanding_router_lookups = 0;
  local_158 = send_udp_packet;
  local_150 = 0;
  local_160 = this;
  ::std::
  bind<void(libtorrent::aux::session_impl::*)(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>),libtorrent::aux::session_impl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&,std::_Placeholder<5>const&>
            (&local_148,(offset_in_session_impl_to_subr *)&local_158,&local_160,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
             ,(_Placeholder<3> *)&::std::placeholders::_3,
             (_Placeholder<4> *)&::std::placeholders::_4,(_Placeholder<5> *)&::std::placeholders::_5
            );
  ::std::
  function<void(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>,void>
            ((function<void(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
              *)&local_130,&local_148);
  local_188.this = this;
  ::std::
  function<void(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)>
  ::
  function<libtorrent::aux::session_impl::session_impl(boost::asio::io_context&,libtorrent::settings_pack_const&,std::function<std::unique_ptr<libtorrent::disk_interface,std::default_delete<libtorrent::disk_interface>>(boost::asio::io_context&,libtorrent::settings_interface_const&,libtorrent::counters&)>,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::session_flags_tag,void>)::__0,void>
            ((function<void(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)>
              *)&local_180,&local_188);
  aux::utp_socket_manager::utp_socket_manager
            (&this->m_utp_socket_manager,&local_130,&local_180,this->m_io_context,&this->m_settings,
             &this->m_stats_counters,(void *)0x0);
  ::std::
  function<void_(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>)>
  ::~function(&local_180);
  ::std::
  function<void_(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::~function(&local_130);
  local_1d0 = send_udp_packet;
  local_1c8 = 0;
  local_1d8 = this;
  ::std::
  bind<void(libtorrent::aux::session_impl::*)(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>),libtorrent::aux::session_impl*,std::_Placeholder<1>const&,std::_Placeholder<2>const&,std::_Placeholder<3>const&,std::_Placeholder<4>const&,std::_Placeholder<5>const&>
            (&local_1c0,(offset_in_session_impl_to_subr *)&local_1d0,&local_1d8,
             (_Placeholder<1> *)&::std::placeholders::_1,(_Placeholder<2> *)&::std::placeholders::_2
             ,(_Placeholder<3> *)&::std::placeholders::_3,
             (_Placeholder<4> *)&::std::placeholders::_4,(_Placeholder<5> *)&::std::placeholders::_5
            );
  ::std::
  function<void(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>,std::_Placeholder<2>,std::_Placeholder<3>,std::_Placeholder<4>,std::_Placeholder<5>))(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>,void>
            ((function<void(std::weak_ptr<libtorrent::aux::utp_socket_interface>,boost::asio::ip::basic_endpoint<boost::asio::ip::udp>const&,libtorrent::span<char_const>,boost::system::error_code&,libtorrent::flags::bitfield_flag<unsigned_char,libtorrent::aux::udp_send_flags_tag,void>)>
              *)&local_1a8,&local_1c0);
  local_220 = on_incoming_utp_ssl;
  local_218 = 0;
  local_228 = this;
  ::std::
  bind<void(libtorrent::aux::session_impl::*)(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>),libtorrent::aux::session_impl*,std::_Placeholder<1>const&>
            (&local_210,(offset_in_session_impl_to_subr *)&local_220,&local_228,
             (_Placeholder<1> *)&::std::placeholders::_1);
  ::std::
  function<void(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)>
  ::
  function<std::_Bind<void(libtorrent::aux::session_impl::*(libtorrent::aux::session_impl*,std::_Placeholder<1>))(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)>,void>
            ((function<void(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>,libtorrent::socks5_stream,libtorrent::aux::http_stream,libtorrent::aux::utp_stream,libtorrent::i2p_stream,libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context&>,boost::asio::execution::detail::blocking::never_t<0>,boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>>,boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>>>>>>,libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>>)>
              *)&local_1f8,&local_210);
  aux::utp_socket_manager::utp_socket_manager
            (&this->m_ssl_utp_socket_manager,&local_1a8,&local_1f8,this->m_io_context,
             &this->m_settings,&this->m_stats_counters,&this->m_peer_ssl_ctx);
  ::std::
  function<void_(libtorrent::aux::polymorphic_socket<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>,_libtorrent::socks5_stream,_libtorrent::aux::http_stream,_libtorrent::aux::utp_stream,_libtorrent::i2p_stream,_libtorrent::aux::ssl_stream<libtorrent::aux::noexcept_move_only<boost::asio::basic_stream_socket<boost::asio::ip::tcp,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>_>_>,_libtorrent::aux::ssl_stream<libtorrent::socks5_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::http_stream>,_libtorrent::aux::ssl_stream<libtorrent::aux::utp_stream>_>)>
  ::~function(&local_1f8);
  ::std::
  function<void_(std::weak_ptr<libtorrent::aux::utp_socket_interface>,_const_boost::asio::ip::basic_endpoint<boost::asio::ip::udp>_&,_libtorrent::span<const_char>,_boost::system::error_code_&,_libtorrent::flags::bitfield_flag<unsigned_char,_libtorrent::aux::udp_send_flags_tag,_void>)>
  ::~function(&local_1a8);
  this->m_boost_connections = 0;
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>(&this->m_timer,this->m_io_context,(type *)0x0);
  ::std::
  deque<std::weak_ptr<libtorrent::aux::torrent>,_std::allocator<std::weak_ptr<libtorrent::aux::torrent>_>_>
  ::deque(&this->m_dht_torrents);
  ::std::
  deque<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>,_std::allocator<std::pair<std::weak_ptr<libtorrent::aux::torrent>,_int>_>_>
  ::deque(&this->m_prio_torrents);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>
            (&this->m_lsd_announce_timer,this->m_io_context,(type *)0x0);
  boost::asio::
  basic_waitable_timer<std::chrono::_V2::system_clock,_boost::asio::wait_traits<std::chrono::_V2::system_clock>,_boost::asio::execution::any_executor<boost::asio::execution::context_as_t<boost::asio::execution_context_&>,_boost::asio::execution::detail::blocking::never_t<0>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::blocking::possibly_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::tracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::outstanding_work::untracked_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::fork_t<0>_>,_boost::asio::execution::prefer_only<boost::asio::execution::detail::relationship::continuation_t<0>_>_>_>
  ::basic_waitable_timer<boost::asio::io_context>
            (&this->m_close_file_timer,this->m_io_context,(type *)0x0);
  this->m_next_downloading_connect_torrent = 0;
  this->m_next_finished_connect_torrent = 0;
  this->m_download_connect_attempts = 0;
  this->m_next_scrape_torrent = 0;
  ::std::
  array<std::vector<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>,_5UL>
  ::array(&this->m_ses_extensions);
  this->m_deferred_submit_disk_jobs = false;
  this->m_pending_auto_manage = false;
  this->m_need_auto_manage = false;
  this->m_abort = false;
  local_229 = (bitfield_flag)
              libtorrent::flags::operator&
                        ((bitfield_flag<unsigned_char,_libtorrent::session_flags_tag,_void>)
                         this_local._7_1_,
                         (bitfield_flag<unsigned_char,_libtorrent::session_flags_tag,_void>)0x4);
  bVar1 = libtorrent::flags::bitfield_flag::operator_cast_to_bool(&local_229);
  this->m_paused = bVar1;
  this->m_posted_stats_header = false;
  validate_settings(this);
  return;
}

Assistant:

session_impl::session_impl(io_context& ioc, settings_pack const& pack
		, disk_io_constructor_type disk_io_constructor
		, session_flags_t const flags)
		: m_settings(pack)
		, m_io_context(ioc)
#if TORRENT_USE_SSL
		, m_ssl_ctx(ssl::context::tls_client)
#ifdef TORRENT_SSL_PEERS
		, m_peer_ssl_ctx(ssl::context::tls)
#endif
#endif // TORRENT_USE_SSL
		, m_alerts(m_settings.get_int(settings_pack::alert_queue_size)
			, alert_category_t{static_cast<unsigned int>(m_settings.get_int(settings_pack::alert_mask))})
		, m_disk_thread((disk_io_constructor ? disk_io_constructor : default_disk_io_constructor)
			(m_io_context, m_settings, m_stats_counters))
		, m_download_rate(peer_connection::download_channel)
		, m_upload_rate(peer_connection::upload_channel)
		, m_host_resolver(m_io_context)
		, m_tracker_manager(
			std::bind(&session_impl::send_udp_packet_listen, this, _1, _2, _3, _4, _5)
			, std::bind(&session_impl::send_udp_packet_hostname_listen, this, _1, _2, _3, _4, _5, _6)
			, m_stats_counters
			, m_host_resolver
			, m_settings
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
			, *this
#endif
			)
		, m_work(make_work_guard(m_io_context))
#if TORRENT_USE_I2P
		, m_i2p_conn(m_io_context)
#endif
		, m_created(clock_type::now())
		, m_last_tick(m_created)
		, m_last_second_tick(m_created - milliseconds(900))
		, m_last_choke(m_created)
		, m_last_auto_manage(m_created)
#ifndef TORRENT_DISABLE_DHT
		, m_dht_announce_timer(m_io_context)
#endif
		, m_utp_socket_manager(
			std::bind(&session_impl::send_udp_packet, this, _1, _2, _3, _4, _5)
			, [this](socket_type s) { this->incoming_connection(std::move(s)); }
			, m_io_context
			, m_settings, m_stats_counters, nullptr)
#ifdef TORRENT_SSL_PEERS
		, m_ssl_utp_socket_manager(
			std::bind(&session_impl::send_udp_packet, this, _1, _2, _3, _4, _5)
			, std::bind(&session_impl::on_incoming_utp_ssl, this, _1)
			, m_io_context
			, m_settings, m_stats_counters
			, &m_peer_ssl_ctx)
#endif
		, m_timer(m_io_context)
		, m_lsd_announce_timer(m_io_context)
		, m_close_file_timer(m_io_context)
		, m_paused(flags & session::paused)
	{
#if !defined TORRENT_DISABLE_LOGGING || TORRENT_USE_ASSERTS
		validate_settings();
#endif
	}